

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds.cpp
# Opt level: O2

int main(void)

{
  __array array;
  size_t n;
  istream_iterator<int,_char,_std::char_traits<char>,_long> reader;
  _Head_base<0UL,_int_*,_false> local_60;
  unsigned_long local_58;
  istream_iterator<int,_char,_std::char_traits<char>,_long> local_50;
  int local_40 [4];
  undefined8 *local_30;
  char *local_28;
  istream_iterator<int,_char,_std::char_traits<char>,_long> local_20;
  
  std::istream::_M_extract<unsigned_long>(&std::cin);
  std::make_unique<int[]>((size_t)&local_60);
  std::istream_iterator<int,_char,_std::char_traits<char>,_long>::istream_iterator
            (&local_50,(istream_type *)&std::cin);
  local_20._M_stream = local_50._M_stream;
  local_20._M_value = local_50._M_value;
  local_20._M_ok = local_50._M_ok;
  std::copy_n<std::istream_iterator<int,char,std::char_traits<char>,long>,unsigned_long,int*>
            (&local_20,local_58,local_60._M_head_impl);
  local_30 = &std::cout;
  local_28 = "\n";
  std::reverse_copy<int*,std::ostream_iterator<int,char,std::char_traits<char>>>
            (local_40,local_60._M_head_impl,
             (ostream_iterator<int,_char,_std::char_traits<char>_> *)
             (local_60._M_head_impl + local_58));
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr
            ((unique_ptr<int[],_std::default_delete<int[]>_> *)&local_60);
  return 0;
}

Assistant:

int main() {
  size_t n;
  std::cin >> n;
  auto array = std::make_unique<int[]>(n);
  auto reader = std::istream_iterator<int>(std::cin);
  auto printer = std::ostream_iterator<int>(std::cout, "\n");
  std::copy_n(reader, n, array.get());
  std::reverse_copy(array.get(), array.get() + n, printer);
  return 0;
}